

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void vm_free(VM *vm)

{
  long lVar1;
  long lVar2;
  
  if (0 < vm->fns_count) {
    lVar1 = 8;
    lVar2 = 0;
    do {
      free(*(void **)((long)&vm->fns->pkg + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < vm->fns_count);
  }
  free(vm->pkgs);
  free(vm->fns);
  free(vm->consts);
  free(vm->stack);
  return;
}

Assistant:

void vm_free(VM *vm) {
	for (int i = 0; i < vm->fns_count; i++) {
		free(vm->fns[i].ins);
	}
	free(vm->pkgs);
	free(vm->fns);
	free(vm->consts);
	free(vm->stack);
}